

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_normalize_space(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  bool bVar1;
  bool bVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  int iVar5;
  lysc_node *plVar6;
  ulong uVar7;
  size_t __size;
  void *ptr;
  char *pcVar8;
  lyxp_set_node *plVar9;
  bool bVar10;
  uint uVar11;
  char *format;
  LY_ERR ret__;
  byte bVar12;
  ulong uVar13;
  ly_ctx *ctx;
  uint uVar14;
  
  if ((options & 0x1c) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    LVar4 = lyxp_set_cast(set,LYXP_SET_STRING);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    pcVar8 = (set->val).str;
    bVar10 = false;
    uVar7 = 0;
    do {
      while( true ) {
        iVar5 = (int)uVar7;
        uVar7 = (ulong)(byte)pcVar8[uVar7];
        if (uVar7 < 0x21) break;
LAB_001a7bc0:
        uVar7 = (ulong)(iVar5 + 1);
        bVar10 = false;
      }
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0) {
          return LY_SUCCESS;
        }
        goto LAB_001a7bc0;
      }
      if (bVar10 || iVar5 == 0) break;
      uVar7 = (ulong)(iVar5 + 1);
      bVar10 = true;
    } while (pcVar8[uVar7] != '\0');
    __size = strlen(pcVar8);
    ptr = malloc(__size);
    if (ptr != (void *)0x0) {
      uVar7 = 0;
      bVar10 = false;
      uVar11 = 0;
LAB_001a7be6:
      bVar12 = pcVar8[uVar11];
      uVar13 = (ulong)bVar12;
      uVar14 = (uint)uVar7;
      bVar2 = false;
      if (uVar13 < 0x21) {
        if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
          bVar2 = false;
          if (uVar13 != 0) goto LAB_001a7c11;
          if (uVar14 == 0) {
            uVar14 = 0;
          }
          else {
            uVar7 = (ulong)*(byte *)((long)ptr + (ulong)(uVar14 - 1));
            if ((uVar7 < 0x21) && ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0)) {
              uVar14 = uVar14 - 1;
            }
          }
          plVar9 = (lyxp_set_node *)ly_realloc(ptr,(ulong)(uVar14 + 1));
          if (plVar9 != (lyxp_set_node *)0x0) {
            *(undefined1 *)((long)&plVar9->node + (ulong)uVar14) = 0;
            free((set->val).nodes);
            (set->val).nodes = plVar9;
            return LY_SUCCESS;
          }
          goto LAB_001a7cc4;
        }
        bVar12 = 0x20;
        bVar1 = !bVar10;
        bVar10 = true;
        bVar2 = true;
        if (bVar1 && uVar11 != 0) goto LAB_001a7c11;
      }
      else {
LAB_001a7c11:
        bVar10 = bVar2;
        *(byte *)((long)ptr + uVar7) = bVar12;
        uVar7 = (ulong)(uVar14 + 1);
      }
      uVar11 = uVar11 + 1;
      goto LAB_001a7be6;
    }
LAB_001a7cc4:
    ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_normalize_space");
    return LY_EMEM;
  }
  if (((arg_count != 0) && ((*args)->type == LYXP_SET_SCNODE_SET)) &&
     (plVar6 = warn_get_scnode_in_ctx(*args), plVar6 != (lysc_node *)0x0)) {
    if ((plVar6->nodetype & 0xc) == 0) {
      ctx = set->ctx;
      pcVar8 = lys_nodetype2str(plVar6->nodetype);
      format = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      lVar3 = warn_is_string_type((lysc_type *)plVar6[1].parent);
      if (lVar3 != '\0') goto LAB_001a7c79;
      ctx = set->ctx;
      pcVar8 = plVar6->name;
      format = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_normalize_space",pcVar8);
  }
LAB_001a7c79:
  set_scnode_clear_ctx(set,1);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_normalize_space(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i, new_used;
    char *new;
    ly_bool have_spaces = 0, space_before = 0;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    rc = lyxp_set_cast(set, LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return LY_SUCCESS;
}